

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall trun::Process::ExecuteAndWait(Process *this)

{
  bool bVar1;
  string local_38;
  Process *local_18;
  Process *this_local;
  
  local_18 = this;
  bVar1 = Process_Unix::PrepareFileDescriptors(&this->process);
  if (bVar1) {
    bVar1 = Process_Unix::CreatePipes(&this->process);
    if (bVar1) {
      bVar1 = Process_Unix::SetNonBlocking(&this->process);
      if (bVar1) {
        bVar1 = Process_Unix::Duplicate(&this->process);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_38,&this->command);
          this_local._7_1_ =
               Process_Unix::SpawnAndLoop
                         (&this->process,&local_38,&this->arguments,&this->super_ProcessCallbackBase
                         );
          std::__cxx11::string::~string((string *)&local_38);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Process::ExecuteAndWait() {
	if (!process.PrepareFileDescriptors()) return false;
	if (!process.CreatePipes()) return false;
	if (!process.SetNonBlocking()) return false;
	if (!process.Duplicate()) return false;
	return process.SpawnAndLoop(command, arguments, dynamic_cast<ProcessCallbackBase *>(this));
}